

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O2

__m128i scale_1_to_2_phase_0_kernel(__m128i *s,__m128i *f)

{
  __m128i alVar1;
  __m128i ss [4];
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 local_28;
  undefined1 uStack_27;
  undefined1 uStack_26;
  undefined1 uStack_25;
  undefined1 uStack_24;
  undefined1 uStack_23;
  undefined1 uStack_22;
  undefined1 uStack_21;
  undefined1 uStack_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  undefined1 uStack_1c;
  undefined1 uStack_1b;
  undefined1 uStack_1a;
  undefined1 uStack_19;
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  undefined1 uStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  
  local_48 = (undefined1)(*s)[0];
  uStack_46 = *(undefined1 *)((long)*s + 1);
  uStack_44 = *(undefined1 *)((long)*s + 2);
  uStack_42 = *(undefined1 *)((long)*s + 3);
  uStack_40 = *(undefined1 *)((long)*s + 4);
  uStack_3e = *(undefined1 *)((long)*s + 5);
  uStack_3c = *(undefined1 *)((long)*s + 6);
  uStack_3a = *(undefined1 *)((long)*s + 7);
  uStack_47 = (undefined1)s[1][0];
  uStack_45 = *(undefined1 *)((long)s[1] + 1);
  uStack_43 = *(undefined1 *)((long)s[1] + 2);
  uStack_41 = *(undefined1 *)((long)s[1] + 3);
  uStack_3f = *(undefined1 *)((long)s[1] + 4);
  uStack_3d = *(undefined1 *)((long)s[1] + 5);
  uStack_3b = *(undefined1 *)((long)s[1] + 6);
  uStack_39 = *(undefined1 *)((long)s[1] + 7);
  local_38 = (undefined1)s[2][0];
  uStack_36 = *(undefined1 *)((long)s[2] + 1);
  uStack_34 = *(undefined1 *)((long)s[2] + 2);
  uStack_32 = *(undefined1 *)((long)s[2] + 3);
  uStack_30 = *(undefined1 *)((long)s[2] + 4);
  uStack_2e = *(undefined1 *)((long)s[2] + 5);
  uStack_2c = *(undefined1 *)((long)s[2] + 6);
  uStack_2a = *(undefined1 *)((long)s[2] + 7);
  uStack_37 = (undefined1)s[3][0];
  uStack_35 = *(undefined1 *)((long)s[3] + 1);
  uStack_33 = *(undefined1 *)((long)s[3] + 2);
  uStack_31 = *(undefined1 *)((long)s[3] + 3);
  uStack_2f = *(undefined1 *)((long)s[3] + 4);
  uStack_2d = *(undefined1 *)((long)s[3] + 5);
  uStack_2b = *(undefined1 *)((long)s[3] + 6);
  uStack_29 = *(undefined1 *)((long)s[3] + 7);
  local_28 = (undefined1)s[4][0];
  uStack_26 = *(undefined1 *)((long)s[4] + 1);
  uStack_24 = *(undefined1 *)((long)s[4] + 2);
  uStack_22 = *(undefined1 *)((long)s[4] + 3);
  uStack_20 = *(undefined1 *)((long)s[4] + 4);
  uStack_1e = *(undefined1 *)((long)s[4] + 5);
  uStack_1c = *(undefined1 *)((long)s[4] + 6);
  uStack_1a = *(undefined1 *)((long)s[4] + 7);
  uStack_27 = (undefined1)s[5][0];
  uStack_25 = *(undefined1 *)((long)s[5] + 1);
  uStack_23 = *(undefined1 *)((long)s[5] + 2);
  uStack_21 = *(undefined1 *)((long)s[5] + 3);
  uStack_1f = *(undefined1 *)((long)s[5] + 4);
  uStack_1d = *(undefined1 *)((long)s[5] + 5);
  uStack_1b = *(undefined1 *)((long)s[5] + 6);
  uStack_19 = *(undefined1 *)((long)s[5] + 7);
  local_18 = (undefined1)s[6][0];
  uStack_16 = *(undefined1 *)((long)s[6] + 1);
  uStack_14 = *(undefined1 *)((long)s[6] + 2);
  uStack_12 = *(undefined1 *)((long)s[6] + 3);
  uStack_10 = *(undefined1 *)((long)s[6] + 4);
  uStack_e = *(undefined1 *)((long)s[6] + 5);
  uStack_c = *(undefined1 *)((long)s[6] + 6);
  uStack_a = *(undefined1 *)((long)s[6] + 7);
  uStack_17 = (undefined1)s[7][0];
  uStack_15 = *(undefined1 *)((long)s[7] + 1);
  uStack_13 = *(undefined1 *)((long)s[7] + 2);
  uStack_11 = *(undefined1 *)((long)s[7] + 3);
  uStack_f = *(undefined1 *)((long)s[7] + 4);
  uStack_d = *(undefined1 *)((long)s[7] + 5);
  uStack_b = *(undefined1 *)((long)s[7] + 6);
  uStack_9 = *(undefined1 *)((long)s[7] + 7);
  alVar1 = convolve8_8_ssse3((__m128i *)&local_48,f);
  alVar1[0] = alVar1[0];
  alVar1[1] = alVar1[1];
  return alVar1;
}

Assistant:

static inline __m128i scale_1_to_2_phase_0_kernel(const __m128i *const s,
                                                  const __m128i *const f) {
  __m128i ss[4], temp;

  ss[0] = _mm_unpacklo_epi8(s[0], s[1]);
  ss[1] = _mm_unpacklo_epi8(s[2], s[3]);
  ss[2] = _mm_unpacklo_epi8(s[4], s[5]);
  ss[3] = _mm_unpacklo_epi8(s[6], s[7]);
  temp = convolve8_8_ssse3(ss, f);
  return _mm_packus_epi16(temp, temp);
}